

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O0

void __thiscall MyProgress::beginorder(MyProgress *this,Graph *param_2,Float cost)

{
  ostream *poVar1;
  float in_XMM0_Da;
  string local_38 [32];
  int local_18;
  float local_14;
  
  local_14 = in_XMM0_Da;
  poVar1 = std::operator<<((ostream *)&std::cerr,"f = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  local_18 = (int)std::setprecision(6);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1," { ");
  now_abi_cxx11_();
  std::operator<<(poVar1,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void beginorder(const Graph*, Float cost) const
  {
    std::cerr << "f = " << std::fixed << std::setprecision(6) << cost << " { " << now();
  }